

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

int __thiscall QGraphicsScenePrivate::init(QGraphicsScenePrivate *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  QGraphicsScene *pQVar2;
  QGraphicsSceneIndex *t;
  char *pcVar3;
  long in_FS_OFFSET;
  QGraphicsScene *q;
  QGraphicsScene *in_stack_ffffffffffffffb8;
  QGraphicsSceneBspTreeIndex *in_stack_ffffffffffffffc0;
  QRectF *in_stack_fffffffffffffff0;
  QGraphicsScene *this_00;
  
  this_00 = *(QGraphicsScene **)(in_FS_OFFSET + 0x28);
  pQVar2 = q_func(this);
  t = (QGraphicsSceneIndex *)operator_new(0x10);
  QGraphicsSceneBspTreeIndex::QGraphicsSceneBspTreeIndex
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  this->index = t;
  iVar1 = QObjectPrivate::signalIndex((char *)this,(QMetaObject **)0xb46079);
  this->changedSignalIndex = iVar1;
  pcVar3 = (char *)(*(code *)**(undefined8 **)pQVar2)();
  iVar1 = QMetaObject::indexOfSlot(pcVar3);
  this->processDirtyItemsIndex = iVar1;
  pcVar3 = (char *)(*(code *)**(undefined8 **)pQVar2)();
  iVar1 = QMetaObject::indexOfSlot(pcVar3);
  this->polishItemsIndex = iVar1;
  QCoreApplication::instance();
  QApplication::d_func((QApplication *)0x9c01e0);
  QList<QGraphicsScene_*>::append((QList<QGraphicsScene_*> *)0x9c01f4,(parameter_type)t);
  QRectF::QRectF((QRectF *)&stack0xffffffffffffffd8);
  QGraphicsScene::update(this_00,in_stack_fffffffffffffff0);
  if (*(QGraphicsScene **)(in_FS_OFFSET + 0x28) == this_00) {
    return (int)*(QGraphicsScene **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::init()
{
    Q_Q(QGraphicsScene);

    index = new QGraphicsSceneBspTreeIndex(q);

    // Keep this index so we can check for connected slots later on.
    changedSignalIndex = signalIndex("changed(QList<QRectF>)");
    processDirtyItemsIndex = q->metaObject()->indexOfSlot("_q_processDirtyItems()");
    polishItemsIndex = q->metaObject()->indexOfSlot("_q_polishItems()");

    qApp->d_func()->scene_list.append(q);
    q->update();
}